

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GridDataType0.cpp
# Opt level: O1

KString * __thiscall
KDIS::DATA_TYPE::GridDataType0::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,GridDataType0 *this)

{
  pointer puVar1;
  ostream *poVar2;
  pointer puVar3;
  KStringStream ss;
  KString local_1d0;
  stringstream local_1b0 [16];
  ostream local_1a0 [112];
  ios_base local_130 [264];
  
  std::__cxx11::stringstream::stringstream(local_1b0);
  GridData::GetAsString_abi_cxx11_(&local_1d0,&this->super_GridData);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_1a0,local_1d0._M_dataplus._M_p,local_1d0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"GridDataType0:",0xe);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tNumber Of Bytes: ",0x13);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n\tData: ",8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  puVar1 = (this->m_vui8DataVals).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->m_vui8DataVals).
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start; puVar3 != puVar1; puVar3 = puVar3 + 1) {
    std::__ostream_insert<char,std::char_traits<char>>(local_1a0," ",1);
    std::ostream::_M_insert<unsigned_long>((ulong)local_1a0);
  }
  std::__ostream_insert<char,std::char_traits<char>>(local_1a0,"\n",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b0);
  std::ios_base::~ios_base(local_130);
  return __return_storage_ptr__;
}

Assistant:

KString GridDataType0::GetAsString() const
{
    KStringStream ss;

    ss << GridData::GetAsString()
       << "GridDataType0:"
       << "\n\tNumber Of Bytes: " << m_ui16NumBytes
       << "\n\tData: ";

    vector<KUINT8>::const_iterator citr = m_vui8DataVals.begin();
    vector<KUINT8>::const_iterator citrEnd = m_vui8DataVals.end();
    for( ; citr != citrEnd; ++citr )
    {
        ss << " " << ( KUINT16 )*citr;
    }
    ss << "\n";

    return ss.str();
}